

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fy-doc.c
# Opt level: O0

void fy_node_apply(fy_node *fyn,fy_node_applyf func)

{
  byte bVar1;
  fy_node_pair *local_28;
  fy_node_pair *fynp;
  fy_node *fyni;
  fy_node_applyf func_local;
  fy_node *fyn_local;
  
  if ((fyn != (fy_node *)0x0) && (func != (fy_node_applyf)0x0)) {
    (*func)(fyn);
    bVar1 = fyn->field_0x34 & 3;
    if ((fyn->field_0x34 & 3) != 0) {
      if (bVar1 == 1) {
        for (fynp = (fy_node_pair *)fy_node_list_head(&(fyn->field_12).sequence);
            fynp != (fy_node_pair *)0x0;
            fynp = (fy_node_pair *)fy_node_next(&(fyn->field_12).sequence,(fy_node *)fynp)) {
          fy_node_apply((fy_node *)fynp,func);
        }
      }
      else if (bVar1 == 2) {
        for (local_28 = fy_node_pair_list_head(&(fyn->field_12).mapping);
            local_28 != (fy_node_pair *)0x0;
            local_28 = fy_node_pair_next(&(fyn->field_12).mapping,local_28)) {
          fy_node_apply(local_28->key,func);
          fy_node_apply(local_28->value,func);
        }
      }
    }
  }
  return;
}

Assistant:

void fy_node_apply(struct fy_node *fyn, fy_node_applyf func) {
    struct fy_node *fyni;
    struct fy_node_pair *fynp;

    if (!fyn || !func)
        return;

    (*func)(fyn);

    switch (fyn->type) {
        case FYNT_SCALAR:
            break;

        case FYNT_SEQUENCE:
            for (fyni = fy_node_list_head(&fyn->sequence); fyni;
                 fyni = fy_node_next(&fyn->sequence, fyni))
                fy_node_apply(fyni, func);
            break;

        case FYNT_MAPPING:
            for (fynp = fy_node_pair_list_head(&fyn->mapping); fynp;
                 fynp = fy_node_pair_next(&fyn->mapping, fynp)) {

                fy_node_apply(fynp->key, func);
                fy_node_apply(fynp->value, func);
            }
            break;
    }
}